

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::hasQCOMImageProceessingDecoration
          (TGlslangToSpvTraverser *this,Id id,Decoration decor)

{
  pointer pDVar1;
  pointer pDVar2;
  mapped_type *pmVar3;
  pointer pDVar4;
  bool bVar5;
  Id local_c;
  
  local_c = id;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->idToQCOMDecorations,&local_c);
  pDVar1 = (pmVar3->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pDVar2 = (pmVar3->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar1 == pDVar2) {
    bVar5 = false;
  }
  else {
    do {
      pDVar4 = pDVar1 + 1;
      bVar5 = *pDVar1 == decor;
      if (bVar5) {
        return bVar5;
      }
      pDVar1 = pDVar4;
    } while (pDVar4 != pDVar2);
  }
  return bVar5;
}

Assistant:

bool TGlslangToSpvTraverser::hasQCOMImageProceessingDecoration(spv::Id id, spv::Decoration decor)
{
  std::vector<spv::Decoration> &decoVec = idToQCOMDecorations[id];
  for ( auto d : decoVec ) {
    if ( d == decor )
      return true;
  }
  return false;
}